

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Parameters * __thiscall
minja::Parser::parseParameters_abi_cxx11_(Parameters *__return_storage_ptr__,Parser *this)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  long lVar4;
  runtime_error *prVar5;
  allocator<char> local_91;
  vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
  *local_90;
  shared_ptr<minja::Expression> expr;
  string local_78;
  shared_ptr<minja::Expression> value;
  
  local_90 = (vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
              *)__return_storage_ptr__;
  consumeSpaces(this,Strip);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"(",(allocator<char> *)&expr);
  consumeToken(&local_78,this,(string *)&value,Strip);
  sVar1 = local_78._M_string_length;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&value);
  if ((char *)sVar1 == (char *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Expected opening parenthesis in param list");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(pointer *)(local_90 + 0x10) = (pointer)0x0;
  *(undefined8 *)local_90 = 0;
  *(pointer *)(local_90 + 8) = (pointer)0x0;
  bVar3 = false;
  do {
    if ((this->it)._M_current == (this->end)._M_current) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis in call args");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,")",(allocator<char> *)&expr);
    consumeToken(&local_78,this,(string *)&value,Strip);
    sVar1 = local_78._M_string_length;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&value);
    if ((char *)sVar1 != (char *)0x0) {
      return (Parameters *)local_90;
    }
    parseExpression((Parser *)&expr,SUB81(this,0));
    if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected expression in call args");
      goto LAB_001a5efe;
    }
    lVar4 = __dynamic_cast(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,&Expression::typeinfo,&VariableExpr::typeinfo,0);
    if (lVar4 == 0) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
      ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                (local_90,&local_78,&expr);
LAB_001a5d9a:
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&value,"=",&local_91);
      consumeToken(&local_78,this,(string *)&value,Strip);
      sVar1 = local_78._M_string_length;
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&value);
      if ((char *)sVar1 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_78,(string *)(lVar4 + 0x20));
        value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
        ::emplace_back<std::__cxx11::string,decltype(nullptr)>(local_90,&local_78,(void **)&value);
        goto LAB_001a5d9a;
      }
      parseExpression((Parser *)&value,SUB81(this,0));
      if (value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected expression in for named arg");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&local_78,(string *)(lVar4 + 0x20));
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
      ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                (local_90,&local_78,&value);
      std::__cxx11::string::~string((string *)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&value,",",&local_91);
    consumeToken(&local_78,this,(string *)&value,Strip);
    sVar1 = local_78._M_string_length;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&value);
    if ((char *)sVar1 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&value,")",&local_91);
      consumeToken(&local_78,this,(string *)&value,Strip);
      sVar2 = local_78._M_string_length;
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&value);
      bVar3 = true;
      if ((char *)sVar2 == (char *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis in call args");
LAB_001a5efe:
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((char *)sVar1 == (char *)0x0) {
      if (!bVar3) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                   *)local_90);
      }
      return (Parameters *)local_90;
    }
  } while( true );
}

Assistant:

Expression::Parameters parseParameters() {
        consumeSpaces();
        if (consumeToken("(").empty()) throw std::runtime_error("Expected opening parenthesis in param list");

        Expression::Parameters result;

        while (it != end) {
            if (!consumeToken(")").empty()) {
                return result;
            }
            auto expr = parseExpression();
            if (!expr) throw std::runtime_error("Expected expression in call args");

            if (auto ident = dynamic_cast<VariableExpr*>(expr.get())) {
                if (!consumeToken("=").empty()) {
                    auto value = parseExpression();
                    if (!value) throw std::runtime_error("Expected expression in for named arg");
                    result.emplace_back(ident->get_name(), std::move(value));
                } else {
                    result.emplace_back(ident->get_name(), nullptr);
                }
            } else {
                result.emplace_back(std::string(), std::move(expr));
            }
            if (consumeToken(",").empty()) {
              if (consumeToken(")").empty()) {
                throw std::runtime_error("Expected closing parenthesis in call args");
              }
              return result;
            }
        }
        throw std::runtime_error("Expected closing parenthesis in call args");
    }